

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O3

bool __thiscall
ELFIO::symbol_section_accessor_template<const_ELFIO::section>::get_symbol
          (symbol_section_accessor_template<const_ELFIO::section> *this,Elf_Xword index,string *name
          ,Elf64_Addr *value,Elf_Xword *size,uchar *bind,uchar *type,Elf_Half *section_index,
          uchar *other)

{
  _Head_base<0UL,_ELFIO::elf_header_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  
  _Var1._M_head_impl =
       (this->elf_file->header)._M_t.
       super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
       super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
       super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (elf_header *)0x0) {
    iVar3 = (*(_Var1._M_head_impl)->_vptr_elf_header[4])();
    if ((char)iVar3 == '\x01') {
      bVar2 = generic_get_symbol<ELFIO::Elf32_Sym>
                        (this,index,name,value,size,bind,type,section_index,other);
      return bVar2;
    }
  }
  bVar2 = generic_get_symbol<ELFIO::Elf64_Sym>
                    (this,index,name,value,size,bind,type,section_index,other);
  return bVar2;
}

Assistant:

bool get_symbol( Elf_Xword      index,
                     std::string&   name,
                     Elf64_Addr&    value,
                     Elf_Xword&     size,
                     unsigned char& bind,
                     unsigned char& type,
                     Elf_Half&      section_index,
                     unsigned char& other ) const
    {
        bool ret = false;

        if ( elf_file.get_class() == ELFCLASS32 ) {
            ret = generic_get_symbol<Elf32_Sym>( index, name, value, size, bind,
                                                 type, section_index, other );
        }
        else {
            ret = generic_get_symbol<Elf64_Sym>( index, name, value, size, bind,
                                                 type, section_index, other );
        }

        return ret;
    }